

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_RequiresMixedFlags_Test::TestBody(TApp_RequiresMixedFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *opt;
  Option *this_01;
  long lVar3;
  AssertHelper local_1c0;
  TApp *local_1b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--opt1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  opt = CLI::App::add_flag(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--opt2","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  CLI::App::add_flag(this_00,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--opt3","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  CLI::App::add_flag(this_00,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--optall","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  this_01 = CLI::App::add_flag(this_00,&local_110,&local_130);
  CLI::Option::requires(this_01,opt);
  CLI::Option::requires<char_const*,char_const*>(this_01,"--opt2","--opt3");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_1b0[0].ptr_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--opt1","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_190);
  if (local_1b0[0].ptr_ != local_1a0) {
    operator_delete(local_1b0[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_1b0[0].ptr_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--opt2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_190);
  if (local_1b0[0].ptr_ != local_1a0) {
    operator_delete(local_1b0[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_1b0[0].ptr_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--optall","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_190);
  if (local_1b0[0].ptr_ != local_1a0) {
    operator_delete(local_1b0[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_1b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x44f,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b0);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  if (local_1b0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_1b0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b0[0].ptr_ + 8))();
    }
  }
  CLI::App::reset(this_00);
  local_1b0[0].ptr_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--optall","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"--opt1","");
  local_1b8 = &this->super_TApp;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             (string *)local_170);
  lVar3 = 0;
  do {
    if (local_180 + lVar3 != *(undefined1 **)((long)local_190 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_190 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(local_1b8);
  }
  testing::Message::Message((Message *)local_1b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x453,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b0);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  if (local_1b0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_1b0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b0[0].ptr_ + 8))();
    }
  }
  CLI::App::reset(this_00);
  local_1b0[0].ptr_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--optall","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"--opt2","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"--opt1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             local_150);
  lVar3 = 0;
  do {
    if (local_160 + lVar3 != *(undefined1 **)((long)local_170 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_170 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x60);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(local_1b8);
  }
  testing::Message::Message((Message *)local_1b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x457,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b0);
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  if (local_1b0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_1b0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b0[0].ptr_ + 8))();
    }
  }
  CLI::App::reset(this_00);
  local_1b0[0].ptr_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--optall","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"--opt1","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"--opt2","");
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"--opt3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_1b0,
             &local_130);
  lVar3 = 0;
  do {
    if (local_140 + lVar3 != *(undefined1 **)((long)local_150 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_150 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x80);
  TApp::run(local_1b8);
  return;
}

Assistant:

TEST_F(TApp, RequiresMixedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    app.add_flag("--opt2");
    app.add_flag("--opt3");
    app.add_flag("--optall")->requires(opt1, "--opt2", "--opt3");

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--optall"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt2", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--optall", "--opt1", "--opt2", "--opt3"};
    run();
}